

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqlitePagerCommit(Pager *pPager)

{
  sxi32 *psVar1;
  Page *pPVar2;
  int iVar3;
  Page *pPVar4;
  char *zErr;
  long lVar5;
  int get_excl;
  int local_12c;
  Page *local_128 [33];
  
  local_12c = 0;
  if ((pPager->iState < 3) || (pPager->is_mem != 0)) {
LAB_0010e790:
    if ((pPager->is_mem == 0) && (1 < (uint)pPager->iState)) {
      if (pPager->no_jrnl == 0) {
        (*pPager->pVfs->xDelete)(pPager->pVfs,pPager->zJournal,1);
      }
      if (pPager->iLock != 0) {
        (*pPager->pfd->pMethods->xUnlock)(pPager->pfd,1);
        pPager->iLock = 1;
      }
      pPager->iState = 1;
      if (pPager->pVec != (Bitvec *)0x0) {
        unqliteBitvecDestroy(pPager->pVec);
        pPager->pVec = (Bitvec *)0x0;
      }
    }
    *(byte *)&pPager->iFlags = (byte)pPager->iFlags & 0xfe;
    return 0;
  }
  if (pPager->is_rdonly == 0) {
    iVar3 = unqliteFinalizeJournal(pPager,&local_12c,1);
    if (iVar3 != 0) goto LAB_0010e854;
    pPVar4 = pPager->pFirstDirty;
    if (pPVar4 == (Page *)0x0) {
      pPVar4 = (Page *)0x0;
    }
    else {
      memset(local_128,0,0x100);
      do {
        pPVar2 = pPVar4->pDirtyPrev;
        pPVar4->pDirtyPrev = (Page *)0x0;
        lVar5 = 0;
        do {
          if (local_128[lVar5] == (Page *)0x0) {
            local_128[lVar5] = pPVar4;
            goto LAB_0010e8d7;
          }
          pPVar4 = page_merge_dirty(local_128[lVar5],pPVar4);
          local_128[lVar5] = (Page *)0x0;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x1f);
        local_128[0x1f] = page_merge_dirty(local_128[0x1f],pPVar4);
LAB_0010e8d7:
        pPVar4 = pPVar2;
      } while (pPVar2 != (Page *)0x0);
      lVar5 = 1;
      do {
        local_128[0] = page_merge_dirty(local_128[0],local_128[lVar5]);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x20);
      local_128[0]->pDirtyNext = (Page *)0x0;
      pPVar4 = local_128[0];
    }
    if ((local_12c == 0) || (iVar3 = pager_wait_on_lock(pPager,4), iVar3 == 0)) {
      if ((pPager->iFlags & 2) != 0) {
        (*pPager->pfd->pMethods->xSync)(pPager->pfd,2);
      }
      iVar3 = pager_write_dirty_pages(pPager,pPVar4);
      if (iVar3 == 0) {
        while (pPVar4 = pPager->pAll, pPVar4 != (Page *)0x0) {
          pager_unlink_page(pPager,pPVar4);
          pager_release_page(pPager,pPVar4);
        }
        if (pPager->dbSize != pPager->dbOrigSize) {
          (*pPager->pfd->pMethods->xTruncate)(pPager->pfd,pPager->dbSize * (long)pPager->iPageSize);
        }
        (*pPager->pfd->pMethods->xSync)(pPager->pfd,3);
        pPager->iJournalOfft = 0;
        pPager->nRec = 0;
        goto LAB_0010e790;
      }
      *(byte *)&pPager->iFlags = (byte)pPager->iFlags | 1;
      pPager->pFirstDirty = pPVar4;
      zErr = "IO error while writing dirty pages, rollback your database";
    }
    else {
      zErr = "Cannot obtain an Exclusive lock on the target database";
    }
  }
  else {
    iVar3 = -0x4b;
    zErr = "Read-Only database";
  }
  unqliteGenError(pPager->pDb,zErr);
LAB_0010e854:
  psVar1 = &pPager->pDb->iFlags;
  *psVar1 = *psVar1 | 1;
  return iVar3;
}

Assistant:

UNQLITE_PRIVATE int unqlitePagerCommit(Pager *pPager)
{
	int rc;
	/* Commit: Phase One */
	rc = pager_commit_phase1(pPager);
	if( rc != UNQLITE_OK ){
		goto fail;
	}
	/* Commit: Phase Two */
	rc = pager_commit_phase2(pPager);
	if( rc != UNQLITE_OK ){
		goto fail;
	}
	/* Remove stale flags */
	pPager->iFlags &= ~PAGER_CTRL_COMMIT_ERR;
	/* All done */
	return UNQLITE_OK;
fail:
	/* Disable the auto-commit flag */
	pPager->pDb->iFlags |= UNQLITE_FL_DISABLE_AUTO_COMMIT;
	return rc;
}